

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O1

void objectContentToJson(QCborContainerPrivate *o,QByteArray *json,int indent,bool compact)

{
  long lVar1;
  char *s;
  char *s_00;
  long idx;
  long lVar2;
  long in_FS_OFFSET;
  QString local_d8;
  undefined1 local_c0 [24];
  QByteArray local_a8;
  QCborValue local_88;
  QCborValue local_70;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((o != (QCborContainerPrivate *)0x0) && ((o->elements).d.size != 0)) {
    local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_a8,(long)(indent * 4),' ');
    s = "\": ";
    if (compact) {
      s = "\":";
    }
    s_00 = ",\n";
    if (compact) {
      s_00 = ",";
    }
    idx = 0;
    do {
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QCborContainerPrivate::valueAt((QCborValue *)local_58,o,idx);
      QByteArray::append(json,&local_a8);
      QByteArray::append(json,'\"');
      QCborContainerPrivate::valueAt(&local_88,o,idx);
      local_d8.d.d = (Data *)0x0;
      local_d8.d.ptr = (char16_t *)0x0;
      local_d8.d.size = 0;
      QCborValue::toString((QString *)local_c0,&local_88,&local_d8);
      escapedString((QByteArray *)&local_70,(QStringView)local_c0._8_16_);
      QByteArray::append(json,(QByteArray *)&local_70);
      if ((QArrayData *)local_70.n != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_70.n)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_70.n)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_70.n)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_70.n,1,0x10);
        }
      }
      if ((QArrayData *)local_c0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_c0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_c0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_c0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_c0._0_8_,2,0x10);
        }
      }
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_88.container != (QCborContainerPrivate *)0x0) {
        QCborValue::dispose(&local_88);
      }
      QByteArray::append(json,s,-1);
      QCborContainerPrivate::valueAt(&local_70,o,idx + 1);
      valueContentToJson(&local_70,json,indent,compact);
      if (local_70.container != (QCborContainerPrivate *)0x0) {
        QCborValue::dispose(&local_70);
      }
      lVar1 = (o->elements).d.size;
      if (idx + 2 == lVar1) {
        if (!compact) {
          QByteArray::append(json,'\n');
        }
      }
      else {
        QByteArray::append(json,s_00,-1);
      }
      if ((QCborContainerPrivate *)local_58._8_8_ != (QCborContainerPrivate *)0x0) {
        QCborValue::dispose((QCborValue *)local_58);
      }
      lVar2 = idx + 2;
      idx = idx + 2;
    } while (lVar2 != lVar1);
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void objectContentToJson(const QCborContainerPrivate *o, QByteArray &json, int indent, bool compact)
{
    if (!o || o->elements.empty())
        return;

    QByteArray indentString(4*indent, ' ');

    qsizetype i = 0;
    while (true) {
        QCborValue e = o->valueAt(i);
        json += indentString;
        json += '"';
        json += escapedString(o->valueAt(i).toString());
        json += compact ? "\":" : "\": ";
        valueContentToJson(o->valueAt(i + 1), json, indent, compact);

        if ((i += 2) == o->elements.size()) {
            if (!compact)
                json += '\n';
            break;
        }

        json += compact ? "," : ",\n";
    }
}